

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

EmulatorEvent host_run_until_ticks(Host *host,Ticks ticks)

{
  Emulator *e;
  EmulatorEvent event;
  Ticks TVar1;
  
  e = (host->hook_ctx).e;
  TVar1 = emulator_get_ticks(e);
  if (TVar1 <= ticks) {
    do {
      event = emulator_run_until(e,ticks);
      host_handle_event(host,event);
    } while ((event & 0x1c) == 0);
    return event;
  }
  __assert_fail("emulator_get_ticks(e) <= ticks",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",0x169,
                "EmulatorEvent host_run_until_ticks(struct Host *, Ticks)");
}

Assistant:

static EmulatorEvent host_run_until_ticks(struct Host* host, Ticks ticks) {
  Emulator* e = host_get_emulator(host);
  assert(emulator_get_ticks(e) <= ticks);
  EmulatorEvent event;
  do {
    event = emulator_run_until(e, ticks);
    host_handle_event(host, event);
  } while (!(event & (EMULATOR_EVENT_UNTIL_TICKS | EMULATOR_EVENT_BREAKPOINT |
                      EMULATOR_EVENT_INVALID_OPCODE)));
  return event;
}